

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void pugi::impl::anon_unknown_0::insert_attribute_before
               (xml_attribute_struct *attr,xml_attribute_struct *place,xml_node_struct *node)

{
  xml_attribute_struct *pxVar1;
  xml_attribute_struct *prev;
  xml_node_struct *node_local;
  xml_attribute_struct *place_local;
  xml_attribute_struct *attr_local;
  
  pxVar1 = place->prev_attribute_c;
  if (pxVar1->next_attribute == (xml_attribute_struct *)0x0) {
    node->first_attribute = attr;
  }
  else {
    pxVar1->next_attribute = attr;
  }
  attr->prev_attribute_c = pxVar1;
  attr->next_attribute = place;
  place->prev_attribute_c = attr;
  return;
}

Assistant:

inline void insert_attribute_before(xml_attribute_struct* attr, xml_attribute_struct* place, xml_node_struct* node)
	{
		xml_attribute_struct* prev = place->prev_attribute_c;

		if (prev->next_attribute)
			prev->next_attribute = attr;
		else
			node->first_attribute = attr;

		attr->prev_attribute_c = prev;
		attr->next_attribute = place;
		place->prev_attribute_c = attr;
	}